

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O1

void __thiscall
antlr::MismatchedCharException::MismatchedCharException
          (MismatchedCharException *this,int c,int lower,int upper_,bool matchNot,
          CharScanner *scanner_)

{
  int iVar1;
  int line_;
  int column_;
  undefined4 extraout_var;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Mismatched char","");
  iVar1 = (*(scanner_->super_TokenStream)._vptr_TokenStream[0x1a])(scanner_);
  line_ = (*(scanner_->super_TokenStream)._vptr_TokenStream[0x16])(scanner_);
  column_ = (*(scanner_->super_TokenStream)._vptr_TokenStream[0x18])(scanner_);
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_50,(string *)CONCAT44(extraout_var,iVar1),
             line_,column_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedCharException_00302dd0;
  this->mismatchType = matchNot + 3;
  this->foundChar = c;
  this->expecting = lower;
  this->upper = upper_;
  BitSet::BitSet(&this->set,0x40);
  this->scanner = scanner_;
  return;
}

Assistant:

MismatchedCharException::MismatchedCharException(
	int c,
	int lower,
	int upper_,
	bool matchNot,
	CharScanner* scanner_
) : RecognitionException("Mismatched char",
                         scanner_->getFilename(),
								 scanner_->getLine(), scanner_->getColumn())
  , mismatchType(matchNot ? NOT_RANGE : RANGE)
  , foundChar(c)
  , expecting(lower)
  , upper(upper_)
  , scanner(scanner_)
{
}